

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogl_bitmap.c
# Opt level: O0

_Bool al_get_opengl_texture_size(ALLEGRO_BITMAP *bitmap,int *w,int *h)

{
  undefined4 *puVar1;
  uint uVar2;
  undefined4 *in_RDX;
  undefined4 *in_RSI;
  ALLEGRO_BITMAP *in_RDI;
  bool bVar3;
  ALLEGRO_BITMAP_EXTRA_OPENGL *ogl_bitmap;
  ALLEGRO_BITMAP *local_10;
  
  local_10 = in_RDI;
  if (in_RDI->parent != (ALLEGRO_BITMAP *)0x0) {
    local_10 = in_RDI->parent;
  }
  uVar2 = al_get_bitmap_flags(local_10);
  bVar3 = (uVar2 & 0x20) != 0;
  if (bVar3) {
    puVar1 = (undefined4 *)local_10->extra;
    *in_RSI = *puVar1;
    *in_RDX = puVar1[1];
  }
  else {
    *in_RSI = 0;
    *in_RDX = 0;
  }
  return bVar3;
}

Assistant:

bool al_get_opengl_texture_size(ALLEGRO_BITMAP *bitmap, int *w, int *h)
{
   /* The designers of OpenGL ES 1.0 forgot to add a function to query
    * texture sizes, so this will be the only way there to get the texture
    * size. On normal OpenGL also glGetTexLevelParameter could be used.
    */
   ALLEGRO_BITMAP_EXTRA_OPENGL *ogl_bitmap;
   if (bitmap->parent)
      bitmap = bitmap->parent;
   
   if (!(al_get_bitmap_flags(bitmap) & _ALLEGRO_INTERNAL_OPENGL)) {
      *w = 0;
      *h = 0;
      return false;
   }

   ogl_bitmap = bitmap->extra;
   *w = ogl_bitmap->true_w;
   *h = ogl_bitmap->true_h;
   return true;
}